

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_DetachItemViaPointer(cJSON *parent,cJSON *item)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON *pcVar3;
  
  if (item == (cJSON *)0x0 || parent == (cJSON *)0x0) {
    item = (cJSON *)0x0;
  }
  else {
    pcVar1 = parent->child;
    pcVar2 = item->next;
    if (pcVar1 == item) {
      if (pcVar2 != (cJSON *)0x0) {
        pcVar2->prev = item->prev;
      }
      parent->child = pcVar2;
    }
    else {
      pcVar3 = item->prev;
      pcVar3->next = pcVar2;
      if (pcVar2 == (cJSON *)0x0) {
        pcVar1->prev = pcVar3;
      }
      else {
        pcVar2->prev = pcVar3;
      }
    }
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_DetachItemViaPointer(cJSON *parent, cJSON * const item)
{
    if ((parent == NULL) || (item == NULL))
    {
        return NULL;
    }

    if (item != parent->child)
    {
        /* not the first element */
        item->prev->next = item->next;
    }
    if (item->next != NULL)
    {
        /* not the last element */
        item->next->prev = item->prev;
    }

    if (item == parent->child)
    {
        /* first element */
        parent->child = item->next;
    }
    else if (item->next == NULL)
    {
        /* last element */
        parent->child->prev = item->prev;
    }

    /* make sure the detached item doesn't point anywhere anymore */
    item->prev = NULL;
    item->next = NULL;

    return item;
}